

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O2

bool __thiscall
QRhiGles2::compileShader
          (QRhiGles2 *this,GLuint program,QRhiShaderStage *shaderStage,QShaderVersion *shaderVersion
          )

{
  QHash<QRhiShaderStage,_unsigned_int> *this_00;
  Span *pSVar1;
  QOpenGLExtensions *pQVar2;
  GLint GVar3;
  qsizetype qVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  char *pcVar10;
  QHash<QRhiShaderStage,_unsigned_int> *__range3;
  long in_FS_OFFSET;
  const_iterator cVar11;
  piter pVar12;
  iterator iVar13;
  GLsizei length;
  undefined8 uStack_b4;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 local_a4;
  char *local_a0;
  QArrayDataPointer<char> local_98;
  GLint infoLogLength;
  GLint compiled;
  GLint srcLength;
  char *srcStr;
  uint local_5c;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  shaderSource((QByteArray *)&local_58,this,shaderStage,shaderVersion);
  qVar4 = local_58.size;
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    bVar9 = false;
  }
  else {
    this_00 = &this->m_shaderCache;
    cVar11 = QHash<QRhiShaderStage,_unsigned_int>::constFindImpl<QRhiShaderStage>
                       (this_00,shaderStage);
    if (cVar11.i.d == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0 &&
        cVar11.i.bucket == 0) {
      uVar5 = (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
                functions[0x40])((ulong)*(uint *)(&DAT_00605a64 + (long)(int)shaderStage->m_type * 4
                                                 ));
      pcVar10 = local_58.ptr;
      if (local_58.ptr == (char *)0x0) {
        pcVar10 = (char *)&QByteArray::_empty;
      }
      srcLength = (GLint)qVar4;
      srcStr = pcVar10;
      local_5c = uVar5;
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x6c])((ulong)uVar5,1);
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x3c])((ulong)uVar5);
      compiled = 0;
      (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
        [0x58])((ulong)uVar5,0x8b81,&compiled);
      if (compiled == 0) {
        infoLogLength = 0;
        (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
          [0x58])((ulong)uVar5,0x8b84,&infoLogLength);
        local_98.size = 0;
        local_98.d = (Data *)0x0;
        local_98.ptr = (char *)0x0;
        if (1 < infoLogLength) {
          length = 0;
          QByteArray::resize((longlong)&local_98);
          GVar3 = infoLogLength;
          pQVar2 = this->f;
          pcVar6 = QByteArray::data((QByteArray *)&local_98);
          (*(((pQVar2->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
            functions[0x59])((ulong)uVar5,(ulong)(uint)GVar3,&length,pcVar6);
        }
        length = 2;
        local_a4 = 0;
        uStack_b4 = 0;
        uStack_ac = 0;
        uStack_a8 = 0;
        local_a0 = "default";
        pcVar6 = local_98.ptr;
        if (local_98.ptr == (char *)0x0) {
          pcVar6 = (char *)&QByteArray::_empty;
        }
        bVar9 = false;
        QMessageLogger::warning
                  ((char *)&length,"Failed to compile shader: %s\nSource was:\n%s",pcVar6,pcVar10);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
        goto LAB_004e5644;
      }
      if ((this_00->d != (Data *)0x0) && (0x7f < (long)this_00->d->size)) {
        pVar12 = (piter)QHash<QRhiShaderStage,_unsigned_int>::begin(this_00);
        length = (GLsizei)pVar12.d;
        uStack_b4 = pVar12._4_8_;
        uStack_ac = pVar12.bucket._4_4_;
        while( true ) {
          if (pVar12.d == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0 &&
              pVar12.bucket == 0) break;
          pSVar1 = (pVar12.d)->spans;
          uVar8 = pVar12.bucket >> 7;
          (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).
            functions[0x45])((ulong)*(uint *)(pSVar1[uVar8].entries
                                              [pSVar1[uVar8].offsets[(uint)pVar12.bucket & 0x7f]].
                                              storage.data + 0x18));
          QHashPrivate::iterator<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::operator++
                    ((iterator<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)&length);
          pVar12._4_8_ = uStack_b4;
          pVar12.d._0_4_ = length;
          pVar12.bucket._4_4_ = uStack_ac;
        }
        QHash<QRhiShaderStage,_unsigned_int>::clear(this_00);
      }
      iVar13 = QHash<QRhiShaderStage,unsigned_int>::emplace<unsigned_int_const&>
                         ((QHash<QRhiShaderStage,unsigned_int> *)this_00,shaderStage,&local_5c);
      uVar8 = iVar13.i.bucket;
    }
    else {
      pSVar1 = (cVar11.i.d)->spans;
      uVar7 = cVar11.i.bucket >> 7;
      uVar8 = (ulong)((uint)cVar11.i.bucket & 0x7f);
      local_5c = *(uint *)(pSVar1[uVar7].entries[pSVar1[uVar7].offsets[uVar8]].storage.data + 0x18);
    }
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x30])((ulong)program,(ulong)local_5c,uVar8);
    bVar9 = true;
  }
LAB_004e5644:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QRhiGles2::compileShader(GLuint program, const QRhiShaderStage &shaderStage, QShaderVersion *shaderVersion)
{
    const QByteArray source = shaderSource(shaderStage, shaderVersion);
    if (source.isEmpty())
        return false;

    GLuint shader;
    auto cacheIt = m_shaderCache.constFind(shaderStage);
    if (cacheIt != m_shaderCache.constEnd()) {
        shader = *cacheIt;
    } else {
        shader = f->glCreateShader(toGlShaderType(shaderStage.type()));
        const char *srcStr = source.constData();
        const GLint srcLength = source.size();
        f->glShaderSource(shader, 1, &srcStr, &srcLength);
        f->glCompileShader(shader);
        GLint compiled = 0;
        f->glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
        if (!compiled) {
            GLint infoLogLength = 0;
            f->glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLogLength);
            QByteArray log;
            if (infoLogLength > 1) {
                GLsizei length = 0;
                log.resize(infoLogLength);
                f->glGetShaderInfoLog(shader, infoLogLength, &length, log.data());
            }
            qWarning("Failed to compile shader: %s\nSource was:\n%s", log.constData(), source.constData());
            return false;
        }
        if (m_shaderCache.size() >= MAX_SHADER_CACHE_ENTRIES) {
            // Use the simplest strategy: too many cached shaders -> drop them all.
            for (uint shader : m_shaderCache)
                f->glDeleteShader(shader); // does not actually get released yet when attached to a not-yet-released program
            m_shaderCache.clear();
        }
        m_shaderCache.insert(shaderStage, shader);
    }

    f->glAttachShader(program, shader);

    return true;
}